

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

offset_t __thiscall
ser::OffsetTable::GetOffset(OffsetTable *this,Savepoint *savepoint,string *fieldName)

{
  bool bVar1;
  ostream *poVar2;
  SerializationException *this_00;
  pointer ppVar3;
  offset_t oVar4;
  string local_220;
  undefined1 local_200 [8];
  SerializationException exception;
  ostringstream local_1a8 [8];
  ostringstream msg;
  _Self local_30;
  _Self local_28;
  const_iterator iter;
  string *fieldName_local;
  Savepoint *savepoint_local;
  OffsetTable *this_local;
  
  iter._M_node = (_Base_ptr)fieldName;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::find(&this->savepointIndex_,savepoint);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
       ::end(&this->savepointIndex_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ser::Savepoint,_int>_>::operator->
                       (&local_28);
    oVar4 = GetOffset(this,ppVar3->second,(string *)iter._M_node);
    return oVar4;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"Error: savepoint ");
  Savepoint::ToString_abi_cxx11_((string *)((long)&exception.message_.field_2 + 8),savepoint);
  poVar2 = std::operator<<(poVar2,(string *)(exception.message_.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2," is not registered in table\n");
  poVar2 = std::operator<<(poVar2,"Retrieving the offset of the field ");
  poVar2 = std::operator<<(poVar2,(string *)iter._M_node);
  std::operator<<(poVar2," is not possible\n");
  std::__cxx11::string::~string((string *)(exception.message_.field_2._M_local_buf + 8));
  SerializationException::SerializationException((SerializationException *)local_200);
  std::__cxx11::ostringstream::str();
  SerializationException::Init((SerializationException *)local_200,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_200);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

OffsetTable::offset_t OffsetTable::GetOffset(const Savepoint& savepoint, const std::string& fieldName) const
{
    // Find savepoint ID
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    if (iter == savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is not registered in table\n"
            << "Retrieving the offset of the field " << fieldName <<  " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    return GetOffset(iter->second, fieldName);
}